

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  RepeatedField<int> *this_01;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar2;
  int value_local;
  
  value_local = value;
  pVar2 = Insert(this,number);
  pEVar1 = pVar2.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    this_01 = (pEVar1->field_0).repeated_int32_value;
  }
  else {
    pEVar1->type = type;
    pEVar1->is_repeated = true;
    pEVar1->is_packed = packed;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      this_01 = (RepeatedField<int> *)operator_new(0x10);
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->arena_or_elements_ = (void *)0x0;
    }
    else {
      Arena::AllocHook(this_00,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      this_01 = (RepeatedField<int> *)
                ArenaImpl::AllocateAlignedAndAddCleanup
                          (&this_00->impl_,0x10,
                           arena_destruct_object<google::protobuf::RepeatedField<int>>);
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->arena_or_elements_ = this_00;
    }
    (pEVar1->field_0).repeated_string_value =
         (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this_01;
  }
  RepeatedField<int>::Add(this_01,&value_local);
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}